

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

poptItem poptFreeItems(poptItem items,int nitems)

{
  char *pcVar1;
  poptItem in_RAX;
  poptItem extraout_RAX;
  uint uVar2;
  poptItem ppVar3;
  
  if (items != (poptItem)0x0) {
    if (0 < nitems) {
      uVar2 = nitems + 1;
      ppVar3 = items;
      do {
        pcVar1 = (ppVar3->option).longName;
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        (ppVar3->option).longName = (char *)0x0;
        pcVar1 = (ppVar3->option).descrip;
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        (ppVar3->option).descrip = (char *)0x0;
        pcVar1 = (ppVar3->option).argDescrip;
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        (ppVar3->option).argDescrip = (char *)0x0;
        if (ppVar3->argv != (char **)0x0) {
          free(ppVar3->argv);
        }
        ppVar3->argv = (char **)0x0;
        ppVar3 = ppVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    free(items);
    return extraout_RAX;
  }
  return in_RAX;
}

Assistant:

static
poptItem poptFreeItems(poptItem items, int nitems)
{
    if (items != NULL) {
	poptItem item = items;
	while (--nitems >= 0) {
	    item->option.longName = _free(item->option.longName);
	    item->option.descrip = _free(item->option.descrip);
	    item->option.argDescrip = _free(item->option.argDescrip);
	    item->argv = _free(item->argv);
	    item++;
	}
	_free(items);
    }
    return NULL;
}